

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

int __thiscall
Catch::Matchers::Impl::
MatcherImpl<Catch::Matchers::Impl::StdString::EndsWith,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::clone(MatcherImpl<Catch::Matchers::Impl::StdString::EndsWith,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)operator_new(0x30);
  *(undefined4 *)(pp_Var1 + 1) = 0;
  *pp_Var1 = (_func_int *)&PTR__EndsWith_001627c8;
  pp_Var1[2] = (_func_int *)(pp_Var1 + 4);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pp_Var1 + 2),*(long *)(__fn + 0x10),
             *(long *)(__fn + 0x18) + *(long *)(__fn + 0x10));
  (this->
  super_Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable = pp_Var1;
  (**(code **)(*pp_Var1 + 0x10))(pp_Var1);
  return (int)this;
}

Assistant:

virtual Ptr<Matcher<ExpressionT> > clone() const {
            return Ptr<Matcher<ExpressionT> >( new DerivedT( static_cast<DerivedT const&>( *this ) ) );
        }